

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O2

Vec3<float> * __thiscall Imath_2_5::Vec3<float>::normalize(Vec3<float> *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  fVar3 = length(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    uVar1 = this->x;
    uVar2 = this->y;
    auVar4._4_4_ = uVar2;
    auVar4._0_4_ = uVar1;
    auVar4._8_8_ = 0;
    auVar5._4_4_ = fVar3;
    auVar5._0_4_ = fVar3;
    auVar5._8_4_ = extraout_XMM0_Db;
    auVar5._12_4_ = extraout_XMM0_Db;
    auVar5 = divps(auVar4,auVar5);
    this->x = (float)(int)auVar5._0_8_;
    this->y = (float)(int)((ulong)auVar5._0_8_ >> 0x20);
    this->z = this->z / fVar3;
  }
  return this;
}

Assistant:

const Vec3<T> &
Vec3<T>::normalize ()
{
    T l = length();

    if (l != T (0))
    {
        //
        // Do not replace the divisions by l with multiplications by 1/l.
        // Computing 1/l can overflow but the divisions below will always
        // produce results less than or equal to 1.
        //

	x /= l;
	y /= l;
	z /= l;
    }

    return *this;
}